

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QCss::Symbol>::moveAppend
          (QGenericArrayOps<QCss::Symbol> *this,Symbol *b,Symbol *e)

{
  Symbol *pSVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  int iVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pSVar1 = (this->super_QArrayDataPointer<QCss::Symbol>).ptr;
    qVar6 = (this->super_QArrayDataPointer<QCss::Symbol>).size;
    do {
      pSVar1[qVar6].token = b->token;
      pDVar2 = (b->text).d.d;
      (b->text).d.d = (Data *)0x0;
      pSVar1[qVar6].text.d.d = pDVar2;
      pcVar3 = (b->text).d.ptr;
      (b->text).d.ptr = (char16_t *)0x0;
      pSVar1[qVar6].text.d.ptr = pcVar3;
      qVar4 = (b->text).d.size;
      (b->text).d.size = 0;
      pSVar1[qVar6].text.d.size = qVar4;
      iVar5 = b->len;
      pSVar1[qVar6].start = b->start;
      pSVar1[qVar6].len = iVar5;
      b = b + 1;
      qVar6 = (this->super_QArrayDataPointer<QCss::Symbol>).size + 1;
      (this->super_QArrayDataPointer<QCss::Symbol>).size = qVar6;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }